

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

int entersweep(lua_State *L)

{
  global_State *pgVar1;
  GCObject **ppGVar2;
  int i;
  int iVar3;
  GCObject **old;
  
  pgVar1 = L->l_G;
  pgVar1->gcstate = '\x02';
  pgVar1->sweepstrgc = 0;
  iVar3 = 0;
  ppGVar2 = &pgVar1->finobj;
  do {
    iVar3 = iVar3 + 1;
    ppGVar2 = sweeplist(L,ppGVar2,1);
  } while (ppGVar2 == &pgVar1->finobj);
  pgVar1->sweepfin = ppGVar2;
  ppGVar2 = &pgVar1->allgc;
  do {
    ppGVar2 = sweeplist(L,ppGVar2,1);
    iVar3 = iVar3 + 1;
  } while (ppGVar2 == &pgVar1->allgc);
  pgVar1->sweepgc = ppGVar2;
  return iVar3;
}

Assistant:

static int entersweep (lua_State *L) {
  global_State *g = G(L);
  int n = 0;
  g->gcstate = GCSsweepstring;
  lua_assert(g->sweepgc == NULL && g->sweepfin == NULL);
  /* prepare to sweep strings, finalizable objects, and regular objects */
  g->sweepstrgc = 0;
  g->sweepfin = sweeptolive(L, &g->finobj, &n);
  g->sweepgc = sweeptolive(L, &g->allgc, &n);
  return n;
}